

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_test.c
# Opt level: O0

void test_case_unsigned_add(zt_unit_test *test,void *data)

{
  uchar uVar1;
  unsigned_short uVar2;
  uint uVar3;
  int iVar4;
  zt_unit_test *in_RDI;
  char *msg_17;
  char *msg_16;
  char *msg_15;
  char *msg_14;
  char *msg_13;
  char *msg_12;
  char *msg_11;
  char *msg_10;
  char *msg_9;
  char *msg_8;
  char *msg_7;
  char *msg_6;
  char *msg_5;
  char *msg_4;
  char *msg_3;
  char *msg_2;
  char *msg_1;
  char *msg;
  
  uVar1 = zt_uchar_add('\0',0xff);
  if (uVar1 != 0xff) {
    iVar4 = zt_unit_printf(&in_RDI->error,"%s : %s:%d","zt_uchar_add(UCHAR_MIN, -1) == UCHAR_MAX",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/int_test.c"
                           ,0x59);
    if (iVar4 == 0) {
      in_RDI->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)in_RDI->env,1);
  }
  zt_unit_test_add_assertion(in_RDI);
  uVar1 = zt_uchar_add(0xff,'\0');
  if (uVar1 != 0xff) {
    iVar4 = zt_unit_printf(&in_RDI->error,"%s : %s:%d","zt_uchar_add(-1, UCHAR_MIN) == UCHAR_MAX",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/int_test.c"
                           ,0x5a);
    if (iVar4 == 0) {
      in_RDI->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)in_RDI->env,1);
  }
  zt_unit_test_add_assertion(in_RDI);
  uVar1 = zt_uchar_add('\0','\x01');
  if (uVar1 != '\x01') {
    iVar4 = zt_unit_printf(&in_RDI->error,"%s : %s:%d","zt_uchar_add(UCHAR_MIN, 1) == UCHAR_MIN + 1"
                           ,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/int_test.c"
                           ,0x5c);
    if (iVar4 == 0) {
      in_RDI->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)in_RDI->env,1);
  }
  zt_unit_test_add_assertion(in_RDI);
  uVar1 = zt_uchar_add('\x01','\0');
  if (uVar1 != '\x01') {
    iVar4 = zt_unit_printf(&in_RDI->error,"%s : %s:%d","zt_uchar_add(1, UCHAR_MIN) == UCHAR_MIN + 1"
                           ,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/int_test.c"
                           ,0x5d);
    if (iVar4 == 0) {
      in_RDI->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)in_RDI->env,1);
  }
  zt_unit_test_add_assertion(in_RDI);
  uVar1 = zt_uchar_add('\x7f','\x01');
  if (uVar1 != 0x80) {
    iVar4 = zt_unit_printf(&in_RDI->error,"%s : %s:%d",
                           "zt_uchar_add(UCHAR_MAX / 2, 1) == UCHAR_MAX / 2 + 1",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/int_test.c"
                           ,0x61);
    if (iVar4 == 0) {
      in_RDI->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)in_RDI->env,1);
  }
  zt_unit_test_add_assertion(in_RDI);
  uVar1 = zt_uchar_add('\x01','\x7f');
  if (uVar1 != 0x80) {
    iVar4 = zt_unit_printf(&in_RDI->error,"%s : %s:%d",
                           "zt_uchar_add(1, UCHAR_MAX / 2) == UCHAR_MAX / 2 + 1",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/int_test.c"
                           ,0x62);
    if (iVar4 == 0) {
      in_RDI->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)in_RDI->env,1);
  }
  zt_unit_test_add_assertion(in_RDI);
  uVar2 = zt_ushort_add(0,0xffff);
  if (uVar2 != 0xffff) {
    iVar4 = zt_unit_printf(&in_RDI->error,"%s : %s:%d","zt_ushort_add(USHORT_MIN, -1) == USHORT_MAX"
                           ,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/int_test.c"
                           ,0x69);
    if (iVar4 == 0) {
      in_RDI->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)in_RDI->env,1);
  }
  zt_unit_test_add_assertion(in_RDI);
  uVar2 = zt_ushort_add(0xffff,0);
  if (uVar2 != 0xffff) {
    iVar4 = zt_unit_printf(&in_RDI->error,"%s : %s:%d","zt_ushort_add(-1, USHORT_MIN) == USHORT_MAX"
                           ,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/int_test.c"
                           ,0x6a);
    if (iVar4 == 0) {
      in_RDI->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)in_RDI->env,1);
  }
  zt_unit_test_add_assertion(in_RDI);
  uVar2 = zt_ushort_add(0,1);
  if (uVar2 != 1) {
    iVar4 = zt_unit_printf(&in_RDI->error,"%s : %s:%d",
                           "zt_ushort_add(USHORT_MIN, 1) == USHORT_MIN + 1",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/int_test.c"
                           ,0x6c);
    if (iVar4 == 0) {
      in_RDI->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)in_RDI->env,1);
  }
  zt_unit_test_add_assertion(in_RDI);
  uVar2 = zt_ushort_add(1,0);
  if (uVar2 != 1) {
    iVar4 = zt_unit_printf(&in_RDI->error,"%s : %s:%d",
                           "zt_ushort_add(1, USHORT_MIN) == USHORT_MIN + 1",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/int_test.c"
                           ,0x6d);
    if (iVar4 == 0) {
      in_RDI->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)in_RDI->env,1);
  }
  zt_unit_test_add_assertion(in_RDI);
  uVar2 = zt_ushort_add(0x7fff,1);
  if (uVar2 != 0x8000) {
    iVar4 = zt_unit_printf(&in_RDI->error,"%s : %s:%d",
                           "zt_ushort_add(USHORT_MAX / 2, 1) == USHORT_MAX / 2 + 1",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/int_test.c"
                           ,0x71);
    if (iVar4 == 0) {
      in_RDI->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)in_RDI->env,1);
  }
  zt_unit_test_add_assertion(in_RDI);
  uVar2 = zt_ushort_add(1,0x7fff);
  if (uVar2 != 0x8000) {
    iVar4 = zt_unit_printf(&in_RDI->error,"%s : %s:%d",
                           "zt_ushort_add(1, USHORT_MAX / 2) == USHORT_MAX / 2 + 1",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/int_test.c"
                           ,0x72);
    if (iVar4 == 0) {
      in_RDI->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)in_RDI->env,1);
  }
  zt_unit_test_add_assertion(in_RDI);
  uVar3 = zt_uint_add(0,0xffffffff);
  if (uVar3 != 0xffffffff) {
    iVar4 = zt_unit_printf(&in_RDI->error,"%s : %s:%d","zt_uint_add(UINT_MIN, -1) == UINT_MAX",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/int_test.c"
                           ,0x79);
    if (iVar4 == 0) {
      in_RDI->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)in_RDI->env,1);
  }
  zt_unit_test_add_assertion(in_RDI);
  uVar3 = zt_uint_add(0xffffffff,0);
  if (uVar3 != 0xffffffff) {
    iVar4 = zt_unit_printf(&in_RDI->error,"%s : %s:%d","zt_uint_add(-1, UINT_MIN) == UINT_MAX",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/int_test.c"
                           ,0x7a);
    if (iVar4 == 0) {
      in_RDI->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)in_RDI->env,1);
  }
  zt_unit_test_add_assertion(in_RDI);
  uVar3 = zt_uint_add(0,1);
  if (uVar3 != 1) {
    iVar4 = zt_unit_printf(&in_RDI->error,"%s : %s:%d","zt_uint_add(UINT_MIN, 1) == UINT_MIN + 1",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/int_test.c"
                           ,0x7c);
    if (iVar4 == 0) {
      in_RDI->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)in_RDI->env,1);
  }
  zt_unit_test_add_assertion(in_RDI);
  uVar3 = zt_uint_add(1,0);
  if (uVar3 == 1) {
    zt_unit_test_add_assertion(in_RDI);
    uVar3 = zt_uint_add(0x7fffffff,1);
    if (uVar3 != 0x80000000) {
      iVar4 = zt_unit_printf(&in_RDI->error,"%s : %s:%d",
                             "zt_uint_add(UINT_MAX / 2, 1) == UINT_MAX / 2 + 1",
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/int_test.c"
                             ,0x81);
      if (iVar4 == 0) {
        in_RDI->error = (char *)0x0;
      }
      longjmp((__jmp_buf_tag *)in_RDI->env,1);
    }
    zt_unit_test_add_assertion(in_RDI);
    uVar3 = zt_uint_add(1,0x7fffffff);
    if (uVar3 == 0x80000000) {
      zt_unit_test_add_assertion(in_RDI);
      return;
    }
    iVar4 = zt_unit_printf(&in_RDI->error,"%s : %s:%d",
                           "zt_uint_add(1, UINT_MAX / 2) == UINT_MAX / 2 + 1",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/int_test.c"
                           ,0x82);
    if (iVar4 == 0) {
      in_RDI->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)in_RDI->env,1);
  }
  iVar4 = zt_unit_printf(&in_RDI->error,"%s : %s:%d","zt_uint_add(1, UINT_MIN) == UINT_MIN + 1",
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/int_test.c"
                         ,0x7d);
  if (iVar4 == 0) {
    in_RDI->error = (char *)0x0;
  }
  longjmp((__jmp_buf_tag *)in_RDI->env,1);
}

Assistant:

static void
test_case_unsigned_add(struct zt_unit_test *test, void *data UNUSED)
{
    /* UCHAR pos common */
    /* ZT_UNIT_ASSERT_RAISES(test, zt_exception.math.overflow, zt_uchar_add(UCHAR_MAX, 1)); */
    /* ZT_UNIT_ASSERT_RAISES(test, zt_exception.math.overflow, zt_uchar_add(1, UCHAR_MAX)); */
    /* UCHAR neg common */
    ZT_UNIT_ASSERT(test, zt_uchar_add(UCHAR_MIN, -1) == UCHAR_MAX);
    ZT_UNIT_ASSERT(test, zt_uchar_add(-1, UCHAR_MIN) == UCHAR_MAX);
    /* UCHAR limits */
    ZT_UNIT_ASSERT(test, zt_uchar_add(UCHAR_MIN, 1) == UCHAR_MIN + 1);
    ZT_UNIT_ASSERT(test, zt_uchar_add(1, UCHAR_MIN) == UCHAR_MIN + 1);
    /* ZT_UNIT_ASSERT_RAISES(test, zt_exception.math.overflow, zt_uchar_add(UCHAR_MAX, -1)); */
    /* ZT_UNIT_ASSERT_RAISES(test, zt_exception.math.overflow, zt_uchar_add(-1, UCHAR_MAX)); */
    /* UCHAR middle */
    ZT_UNIT_ASSERT(test, zt_uchar_add(UCHAR_MAX / 2, 1) == UCHAR_MAX / 2 + 1);
    ZT_UNIT_ASSERT(test, zt_uchar_add(1, UCHAR_MAX / 2) == UCHAR_MAX / 2 + 1);


    /* USHORT pos common */
    /* ZT_UNIT_ASSERT_RAISES(test, zt_exception.math.overflow, zt_ushort_add(USHORT_MAX, 1)); */
    /* ZT_UNIT_ASSERT_RAISES(test, zt_exception.math.overflow, zt_ushort_add(1, USHORT_MAX)); */
    /* USHORT neg common */
    ZT_UNIT_ASSERT(test, zt_ushort_add(USHORT_MIN, -1) == USHORT_MAX);
    ZT_UNIT_ASSERT(test, zt_ushort_add(-1, USHORT_MIN) == USHORT_MAX);
    /* USHORT limits */
    ZT_UNIT_ASSERT(test, zt_ushort_add(USHORT_MIN, 1) == USHORT_MIN + 1);
    ZT_UNIT_ASSERT(test, zt_ushort_add(1, USHORT_MIN) == USHORT_MIN + 1);
    /* ZT_UNIT_ASSERT_RAISES(test, zt_exception.math.overflow, zt_ushort_add(USHORT_MAX, -1)); */
    /* ZT_UNIT_ASSERT_RAISES(test, zt_exception.math.overflow, zt_ushort_add(-1, USHORT_MAX)); */
    /* USHORT middle */
    ZT_UNIT_ASSERT(test, zt_ushort_add(USHORT_MAX / 2, 1) == USHORT_MAX / 2 + 1);
    ZT_UNIT_ASSERT(test, zt_ushort_add(1, USHORT_MAX / 2) == USHORT_MAX / 2 + 1);


    /* UINT pos common */
    /* ZT_UNIT_ASSERT_RAISES(test, zt_exception.math.overflow, zt_uint_add(UINT_MAX, 1)); */
    /* ZT_UNIT_ASSERT_RAISES(test, zt_exception.math.overflow, zt_uint_add(1, UINT_MAX)); */
    /* UINT neg common */
    ZT_UNIT_ASSERT(test, zt_uint_add(UINT_MIN, -1) == UINT_MAX);
    ZT_UNIT_ASSERT(test, zt_uint_add(-1, UINT_MIN) == UINT_MAX);
    /* UINT limits */
    ZT_UNIT_ASSERT(test, zt_uint_add(UINT_MIN, 1) == UINT_MIN + 1);
    ZT_UNIT_ASSERT(test, zt_uint_add(1, UINT_MIN) == UINT_MIN + 1);
    /* ZT_UNIT_ASSERT_RAISES(test, zt_exception.math.overflow, zt_uint_add(UINT_MAX, -1)); */
    /* ZT_UNIT_ASSERT_RAISES(test, zt_exception.math.overflow, zt_uint_add(-1, UINT_MAX)); */
    /* UINT middle */
    ZT_UNIT_ASSERT(test, zt_uint_add(UINT_MAX / 2, 1) == UINT_MAX / 2 + 1);
    ZT_UNIT_ASSERT(test, zt_uint_add(1, UINT_MAX / 2) == UINT_MAX / 2 + 1);


# ifndef __x86_64__
    /* ULONG pos common */
    /* ZT_UNIT_ASSERT_RAISES(test, zt_exception.math.overflow, zt_ulong_add(ULONG_MAX, 1)); */
    /* ZT_UNIT_ASSERT_RAISES(test, zt_exception.math.overflow, zt_ulong_add(1, ULONG_MAX)); */
    /* ULONG neg common */
    ZT_UNIT_ASSERT(test, zt_ulong_add(ULONG_MIN, -1) == ULONG_MAX);
    ZT_UNIT_ASSERT(test, zt_ulong_add(-1, ULONG_MIN) == ULONG_MAX);
    /* ULONG limits */
    ZT_UNIT_ASSERT(test, zt_ulong_add(ULONG_MIN, 1) == ULONG_MIN + 1);
    ZT_UNIT_ASSERT(test, zt_ulong_add(1, ULONG_MIN) == ULONG_MIN + 1);
    /* ZT_UNIT_ASSERT_RAISES(test, zt_exception.math.overflow, zt_ulong_add(ULONG_MAX, -1)); */
    /* ZT_UNIT_ASSERT_RAISES(test, zt_exception.math.overflow, zt_ulong_add(-1, ULONG_MAX)); */
    /* ULONG middle */
    ZT_UNIT_ASSERT(test, zt_ulong_add(ULONG_MAX / 2, 1) == ULONG_MAX / 2 + 1);
    ZT_UNIT_ASSERT(test, zt_ulong_add(1, ULONG_MAX / 2) == ULONG_MAX / 2 + 1);
# endif /* ifndef __x86_64__ */
}